

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O1

int login(string *cmd,int socket_fd,string *currUser,
         vector<cUser,_std::allocator<cUser>_> *currUsers,int id,bool *msgFlags,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *msgs)

{
  size_type *psVar1;
  pointer paVar2;
  pointer pcVar3;
  uint uVar4;
  bool bVar5;
  ssize_t sVar6;
  ostream *poVar7;
  int iVar8;
  vector<cUser,_std::allocator<cUser>_> *pvVar9;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it;
  undefined8 __it_00;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it_01;
  pointer paVar10;
  long lVar11;
  anon_struct_64_2_84df61a8 *paVar12;
  __normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_> _Var13;
  undefined1 *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  size_type *local_198;
  string password;
  vector<User,_std::allocator<User>_> users;
  long local_158;
  undefined1 local_150 [32];
  _Alloc_hider local_130;
  string username;
  size_type *local_108;
  pointer local_100;
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  uint *local_e8;
  long local_e0;
  uint local_d8 [2];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  size_type *local_c8;
  pointer local_c0;
  size_type local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  int local_84;
  anon_struct_64_2_84df61a8 *local_80;
  undefined1 auStack_78 [8];
  cUser user;
  undefined1 local_48 [8];
  undefined4 uStack_40;
  undefined4 uStack_3c;
  vector<cUser,_std::allocator<cUser>_> *local_38;
  
  local_130._M_p = (pointer)&username._M_string_length;
  username._M_dataplus._M_p = (pointer)0x0;
  username._M_string_length._0_1_ = 0;
  local_198 = &password._M_string_length;
  password._M_dataplus._M_p = (pointer)0x0;
  password._M_string_length._0_1_ = 0;
  local_150._16_8_ = msgFlags;
  local_150._24_8_ = currUser;
  local_84 = socket_fd;
  getUsers();
  std::__cxx11::string::find((char *)cmd,0x1091e5,0);
  std::__cxx11::string::substr((ulong)auStack_78,(ulong)cmd);
  std::__cxx11::string::operator=((string *)&local_130,(string *)auStack_78);
  if (auStack_78 != (undefined1  [8])&user.username._M_string_length) {
    operator_delete((void *)auStack_78);
  }
  std::__cxx11::string::substr((ulong)auStack_78,(ulong)cmd);
  username.field_2._12_4_ = id;
  std::__cxx11::string::operator=((string *)&local_198,(string *)auStack_78);
  psVar1 = &user.username._M_string_length;
  if (auStack_78 != (undefined1  [8])psVar1) {
    operator_delete((void *)auStack_78);
  }
  local_80 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
             _M_start;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_130._M_p,username._M_dataplus._M_p + local_130._M_p);
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,local_198,password._M_dataplus._M_p + (long)local_198);
  local_108 = (size_type *)&local_f8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_1d8,local_1d8 + local_1d0);
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_1b8,local_1b8 + local_1b0);
  local_a0 = local_e0;
  uVar4 = local_f8;
  local_c0 = local_100;
  if (local_108 == (size_type *)&local_f8) {
    user.username.field_2._M_allocated_capacity._4_4_ = uStack_ec;
    user.username.field_2._M_allocated_capacity._0_4_ = uStack_f0;
    auStack_78 = (undefined1  [8])psVar1;
  }
  else {
    auStack_78 = (undefined1  [8])local_108;
  }
  user.username._M_string_length = CONCAT44(uStack_f4,local_f8);
  local_100 = (pointer)0x0;
  local_f8 = local_f8 & 0xffffff00;
  if (local_e8 == local_d8) {
    uStack_40 = uStack_d0;
    uStack_3c = uStack_cc;
    user.username.field_2._8_8_ = local_48;
  }
  else {
    user.username.field_2._8_8_ = local_e8;
  }
  user._32_8_ = local_e0;
  local_e0 = 0;
  local_d8[0] = local_d8[0] & 0xffffff00;
  local_c8 = &local_b8;
  if (auStack_78 == (undefined1  [8])psVar1) {
    local_b8 = CONCAT44(uStack_f4,uVar4);
    uStack_b0 = user.username.field_2._M_allocated_capacity._0_4_;
    uStack_ac = user.username.field_2._M_allocated_capacity._4_4_;
  }
  else {
    local_c8 = (size_type *)auStack_78;
    local_b8 = user.username._M_string_length;
  }
  local_a8 = local_98;
  user.username._M_dataplus._M_p = (pointer)0x0;
  user.username._M_string_length = user.username._M_string_length & 0xffffffffffffff00;
  if ((undefined1 *)user.username.field_2._8_8_ == local_48) {
    uStack_90 = uStack_40;
    uStack_8c = uStack_3c;
  }
  else {
    local_a8 = (undefined1 *)user.username.field_2._8_8_;
  }
  local_108 = (size_type *)&local_f8;
  local_e8 = local_d8;
  auStack_78 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char*>((string *)auStack_78,local_c8,local_c0 + (long)local_c8)
  ;
  user.username.field_2._8_8_ = local_48;
  local_38 = currUsers;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&user.username.field_2 + 8),local_a8,local_a8 + local_a0);
  lVar11 = (long)local_80 - password.field_2._8_8_ >> 8;
  __it_00 = password.field_2._8_8_;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)auStack_78,
                           (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                           __it_00);
      pvVar9 = local_38;
      _Var13._M_current = (anon_struct_64_2_84df61a8 *)__it_00;
      if (bVar5) goto LAB_00105fd2;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)auStack_78,(anon_struct_64_2_84df61a8 *)(__it_00 + 0x40));
      pvVar9 = local_38;
      _Var13._M_current = (anon_struct_64_2_84df61a8 *)(__it_00 + 0x40);
      if (bVar5) goto LAB_00105fd2;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)auStack_78,(anon_struct_64_2_84df61a8 *)(__it_00 + 0x80));
      pvVar9 = local_38;
      _Var13._M_current = (anon_struct_64_2_84df61a8 *)(__it_00 + 0x80);
      if (bVar5) goto LAB_00105fd2;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                            *)auStack_78,(anon_struct_64_2_84df61a8 *)(__it_00 + 0xc0));
      pvVar9 = local_38;
      _Var13._M_current = (anon_struct_64_2_84df61a8 *)(__it_00 + 0xc0);
      if (bVar5) goto LAB_00105fd2;
      __it_00 = __it_00 + 0x100;
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  pvVar9 = local_38;
  lVar11 = (long)local_80 - __it_00 >> 6;
  if (lVar11 == 1) {
LAB_00105fbc:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)auStack_78,
                         (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                         __it_00);
    _Var13._M_current = local_80;
    if (bVar5) {
      _Var13._M_current = (anon_struct_64_2_84df61a8 *)__it_00;
    }
  }
  else if (lVar11 == 2) {
LAB_00105f80:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
            ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                          *)auStack_78,
                         (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                         __it_00);
    _Var13._M_current = (anon_struct_64_2_84df61a8 *)__it_00;
    if (!bVar5) {
      __it_00 = __it_00 + 0x40;
      goto LAB_00105fbc;
    }
  }
  else {
    _Var13._M_current = local_80;
    if ((lVar11 == 3) &&
       (bVar5 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                              *)auStack_78,
                             (__normal_iterator<User_*,_std::vector<User,_std::allocator<User>_>_>)
                             __it_00), _Var13._M_current = (anon_struct_64_2_84df61a8 *)__it_00,
       !bVar5)) {
      __it_00 = __it_00 + 0x40;
      goto LAB_00105f80;
    }
  }
LAB_00105fd2:
  if ((undefined1 *)user.username.field_2._8_8_ != local_48) {
    operator_delete((void *)user.username.field_2._8_8_);
  }
  if (auStack_78 != (undefined1  [8])&user.username._M_string_length) {
    operator_delete((void *)auStack_78);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != (size_type *)&local_f8) {
    operator_delete(local_108);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (_Var13._M_current !=
      users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    __it_01._M_current =
         (pvVar9->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data
         ._M_start;
    paVar12 = (anon_struct_64_2_84df61a8 *)
              (pvVar9->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_150;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_130._M_p,
               username._M_dataplus._M_p + local_130._M_p);
    local_108 = (size_type *)&local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,
               users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage,
               (long)&((users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage)->username)._M_dataplus._M_p +
               local_158);
    uVar4 = local_f8;
    local_c0 = local_100;
    psVar1 = &user.username._M_string_length;
    if (local_108 == (size_type *)&local_f8) {
      user.username.field_2._M_allocated_capacity._4_4_ = uStack_ec;
      user.username.field_2._M_allocated_capacity._0_4_ = uStack_f0;
      auStack_78 = (undefined1  [8])psVar1;
    }
    else {
      auStack_78 = (undefined1  [8])local_108;
    }
    user.username._M_string_length = CONCAT44(uStack_f4,local_f8);
    user.username._M_dataplus._M_p = local_100;
    local_100 = (pointer)0x0;
    local_f8 = local_f8 & 0xffffff00;
    if (auStack_78 == (undefined1  [8])psVar1) {
      local_b8 = CONCAT44(uStack_f4,uVar4);
      uStack_b0 = user.username.field_2._M_allocated_capacity._0_4_;
      uStack_ac = user.username.field_2._M_allocated_capacity._4_4_;
      local_c8 = &local_b8;
    }
    else {
      local_c8 = (size_type *)auStack_78;
      local_b8 = user.username._M_string_length;
    }
    local_108 = (size_type *)&local_f8;
    auStack_78 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_78,local_c8,local_c0 + (long)local_c8);
    lVar11 = ((long)paVar12 - (long)__it_01._M_current >> 3) * -0x3333333333333333 >> 2;
    local_80 = paVar12;
    if (0 < lVar11) {
      lVar11 = lVar11 + 1;
      do {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)auStack_78,__it_01);
        __it._M_current = __it_01._M_current;
        pvVar9 = local_38;
        if (bVar5) goto LAB_00106298;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)auStack_78,__it_01._M_current + 1);
        __it._M_current = __it_01._M_current + 1;
        pvVar9 = local_38;
        if (bVar5) goto LAB_00106298;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)auStack_78,__it_01._M_current + 2);
        __it._M_current = __it_01._M_current + 2;
        pvVar9 = local_38;
        if (bVar5) goto LAB_00106298;
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)auStack_78,__it_01._M_current + 3);
        __it._M_current = __it_01._M_current + 3;
        pvVar9 = local_38;
        if (bVar5) goto LAB_00106298;
        __it_01._M_current = __it_01._M_current + 4;
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
    pvVar9 = local_38;
    paVar12 = local_80;
    lVar11 = ((long)local_80 - (long)__it_01._M_current >> 3) * -0x3333333333333333;
    if (lVar11 == 1) {
LAB_00106286:
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
              ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                            *)auStack_78,__it_01);
      __it._M_current = (anon_struct_40_2_6a8bb0e8 *)paVar12;
      if (bVar5) {
        __it._M_current = __it_01._M_current;
      }
    }
    else {
      __it._M_current = __it_01._M_current;
      if (lVar11 == 2) {
LAB_00106250:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                              *)auStack_78,__it);
        if (!bVar5) {
          __it_01._M_current = __it._M_current + 1;
          goto LAB_00106286;
        }
      }
      else {
        __it._M_current = (anon_struct_40_2_6a8bb0e8 *)paVar12;
        if ((lVar11 == 3) &&
           (bVar5 = __gnu_cxx::__ops::
                    _Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_1>
                    ::operator()((_Iter_pred<login(std::__cxx11::string,int,std::__cxx11::string*,std::vector<cUser,std::allocator<cUser>>&,int,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                  *)auStack_78,__it_01), __it._M_current = __it_01._M_current,
           !bVar5)) {
          __it._M_current = __it_01._M_current + 1;
          goto LAB_00106250;
        }
      }
    }
LAB_00106298:
    if (auStack_78 != (undefined1  [8])&user.username._M_string_length) {
      operator_delete((void *)auStack_78);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8);
    }
    if (local_108 != (size_type *)&local_f8) {
      operator_delete(local_108);
    }
    if (users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)local_150) {
      operator_delete(users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    paVar12 = (anon_struct_64_2_84df61a8 *)
              (pvVar9->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((anon_struct_64_2_84df61a8 *)__it._M_current == paVar12) {
      sVar6 = send(local_84,"Login Confirmed",0x14,0);
      local_80 = paVar12;
      if (sVar6 == -1) {
        perror("send");
      }
      paVar10 = (pvVar9->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar2 = (pvVar9->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar10 != paVar2) {
        do {
          auStack_78 = (undefined1  [8])&user.username._M_string_length;
          pcVar3 = (paVar10->username)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)auStack_78,pcVar3,pcVar3 + (paVar10->username)._M_string_length);
          user.username.field_2._8_4_ = paVar10->id;
          local_c8 = &local_b8;
          pcVar3 = ((_Var13._M_current)->username)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar3,
                     pcVar3 + ((_Var13._M_current)->username)._M_string_length);
          std::__cxx11::string::append((char *)&local_c8);
          std::__cxx11::string::operator=
                    ((string *)
                     ((msgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + (int)user.username.field_2._8_4_)
                     ,(string *)&local_c8);
          if (local_c8 != &local_b8) {
            operator_delete(local_c8);
          }
          *(bool *)(local_150._16_8_ + (long)(int)user.username.field_2._8_4_) = true;
          if (auStack_78 != (undefined1  [8])&user.username._M_string_length) {
            operator_delete((void *)auStack_78);
          }
          paVar10 = paVar10 + 1;
        } while (paVar10 != paVar2);
      }
      auStack_78 = (undefined1  [8])&user.username._M_string_length;
      pcVar3 = ((_Var13._M_current)->username)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_78,pcVar3,
                 pcVar3 + ((_Var13._M_current)->username)._M_string_length);
      std::__cxx11::string::append(auStack_78);
      pvVar9 = local_38;
      paVar12 = local_80;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)auStack_78,
                          (long)user.username._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (auStack_78 != (undefined1  [8])&user.username._M_string_length) {
        operator_delete((void *)auStack_78);
      }
      std::__cxx11::string::_M_assign((string *)local_150._24_8_);
      user.username.field_2._M_allocated_capacity = 0;
      user.username.field_2._8_8_ = 0;
      psVar1 = &user.username._M_string_length;
      user.username._M_dataplus._M_p = (pointer)0x0;
      user.username._M_string_length = 0;
      auStack_78 = (undefined1  [8])psVar1;
      std::vector<cUser,_std::allocator<cUser>_>::emplace_back<cUser>
                (pvVar9,(anon_struct_40_2_6a8bb0e8 *)auStack_78);
      if (auStack_78 != (undefined1  [8])psVar1) {
        operator_delete((void *)auStack_78);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 ((pvVar9->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -1));
      (pvVar9->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.super__Vector_impl_data.
      _M_finish[-1].id = username.field_2._12_4_;
    }
    else {
      sVar6 = send(local_84,"User is already logged in",0x1e,0);
      if (sVar6 == -1) {
        perror("user already logged in");
      }
    }
    if ((anon_struct_64_2_84df61a8 *)__it._M_current == paVar12) {
      iVar8 = 1;
      goto LAB_0010656e;
    }
  }
  sVar6 = send(local_84,"Invalid Username or Password",0x28,0);
  if (sVar6 == -1) {
    perror("send");
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Invalid username or password",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  iVar8 = 0;
  std::ostream::flush();
LAB_0010656e:
  std::vector<User,_std::allocator<User>_>::~vector
            ((vector<User,_std::allocator<User>_> *)((long)&password.field_2 + 8));
  if (local_198 != &password._M_string_length) {
    operator_delete(local_198);
  }
  if ((size_type *)local_130._M_p != &username._M_string_length) {
    operator_delete(local_130._M_p);
  }
  return iVar8;
}

Assistant:

int login(string cmd, int socket_fd, string* currUser,vector<cUser>& currUsers,
    int id, bool* msgFlags, vector<string>& msgs){

    string username;
    string password;
    char command[MAXDATASIZE];
    int numbytes = 0;

    //get the current user's usernames and passwords from the userfile
    vector<User> users = getUsers();

    //parse the command string given to the function
    //if no sername or password this step will catch that and not error out
    size_t spacePos = cmd.find(" ");
    username = cmd.substr(0,spacePos);
    password = cmd.substr(spacePos+1);


    //search through all the users and check for usersname and password
    auto it = find_if(users.begin(),users.end(),[username,password](User u){
        return (u.username == username && u.password == password);
    });

    //if the find function found a match, then add the users name and
    // send confirmation
    if(it != users.end()){
        auto currUsersIt = find_if(currUsers.begin(),currUsers.end(),[username](cUser u){
            return (u.username == username);
        });

        //check if the user is already logged in
        if(currUsersIt == currUsers.end()){

            if(send(socket_fd, "Login Confirmed",20,0) == -1)
                perror("send");

            //broadcast the user has joined
            for(cUser user : currUsers){
                msgs[user.id] = string(it->username + " has joined");
                msgFlags[user.id] = true;
            }

            cout << it->username + " Login." << endl;

            //add evertyhing to the currently logged in users list
            *currUser = it->username;
            currUsers.push_back(cUser());
            currUsers.back().username = it->username;
            currUsers.back().id = id;

            return 1;
        }
        else{
            if(send(socket_fd, "User is already logged in",30,0) == -1)
                perror("user already logged in");
        }

    }

    //otherwise error
    if(send(socket_fd, "Invalid Username or Password",40,0) == -1)
        perror("send");
    cout << "Invalid username or password" << endl;

    return 0;

}